

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O3

DFA * __thiscall re2::Prog::GetDFA(Prog *this,MatchKind kind)

{
  bool bVar1;
  int iVar2;
  DFA *pDVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  lVar6 = 0x88;
  if ((kind != kFirstMatch) && (kind != kManyMatch)) {
    kind = kLongestMatch;
    lVar6 = 0x90;
  }
  pDVar3 = *(DFA **)((long)this->inst_count_ + lVar6 + -0x28);
  if (pDVar3 != (DFA *)0x0) {
    return pDVar3;
  }
  iVar2 = pthread_rwlock_wrlock((pthread_rwlock_t *)&this->dfa_mutex_);
  if (iVar2 == 0) {
    pDVar3 = *(DFA **)((long)this->inst_count_ + lVar6 + -0x28);
    if (pDVar3 == (DFA *)0x0) {
      lVar5 = this->dfa_mem_;
      bVar1 = this->reversed_;
      pDVar3 = (DFA *)operator_new(0x170);
      lVar4 = 0;
      if ((kind & kLongestMatch) != kFirstMatch) {
        lVar4 = lVar5;
      }
      lVar5 = lVar5 / 2;
      if (bVar1 != false) {
        lVar5 = lVar4;
      }
      DFA::DFA(pDVar3,this,kind,lVar5);
      *(DFA **)((long)this->inst_count_ + lVar6 + -0x28) = pDVar3;
    }
    iVar2 = pthread_rwlock_unlock((pthread_rwlock_t *)&this->dfa_mutex_);
    if (iVar2 == 0) {
      return pDVar3;
    }
  }
  abort();
}

Assistant:

DFA* Prog::GetDFA(MatchKind kind) {
  std::atomic<DFA*>* pdfa;
  if (kind == kFirstMatch || kind == kManyMatch) {
    pdfa = &dfa_first_;
  } else {
    kind = kLongestMatch;
    pdfa = &dfa_longest_;
  }

  // Quick check.
  DFA* dfa = pdfa->load(std::memory_order_acquire);
  if (dfa != NULL)
    return dfa;

  MutexLock l(&dfa_mutex_);
  dfa = pdfa->load(std::memory_order_relaxed);
  if (dfa != NULL)
    return dfa;

  // For a forward DFA, half the memory goes to each DFA.
  // For a reverse DFA, all the memory goes to the
  // "longest match" DFA, because RE2 never does reverse
  // "first match" searches.
  int64 m = dfa_mem_/2;
  if (reversed_) {
    if (kind == kLongestMatch || kind == kManyMatch)
      m = dfa_mem_;
    else
      m = 0;
  }
  dfa = new DFA(this, kind, m);

  // Synchronize with "quick check" above.
  pdfa->store(dfa, std::memory_order_release);
  return dfa;
}